

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_avx2.c
# Opt level: O0

void cdef_copy_rect8_8bit_to_16bit_avx2
               (uint16_t *dst,int dstride,uint8_t *src,int sstride,int width,int height)

{
  ulong uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 *puVar10;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  int k;
  int i_4;
  __m128i row1_2;
  __m128i row0_2;
  int i_3;
  __m128i row1_1;
  __m128i row0_1;
  int i_2;
  __m128i row1;
  __m128i row0;
  int i_1;
  __m128i row11;
  __m128i row10;
  __m128i row01;
  __m128i row00;
  int i;
  int remaining_width;
  int j;
  int local_4f8;
  int local_4f4;
  int local_4c4;
  int local_494;
  int local_464;
  int local_420;
  uint local_41c;
  int local_418;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_150;
  undefined8 uStack_148;
  ulong uStack_98;
  ulong uStack_78;
  undefined8 local_70;
  undefined8 local_50;
  
  local_418 = 0;
  local_41c = in_R8D;
  if (0x1f < (int)in_R8D) {
    local_420 = 0;
    do {
      local_418 = 0;
      do {
        auVar3 = *(undefined1 (*) [16])(in_RDX + (local_420 * in_ECX + local_418 + 0x10));
        auVar5 = *(undefined1 (*) [16])(in_RDX + ((local_420 + 1) * in_ECX + local_418));
        auVar6 = *(undefined1 (*) [16])(in_RDX + ((local_420 + 1) * in_ECX + local_418 + 0x10));
        puVar10 = (undefined8 *)(in_RDI + (long)(local_420 * in_ESI + local_418) * 2);
        auVar4 = vpmovzxbw_avx2(*(undefined1 (*) [16])(in_RDX + (local_420 * in_ECX + local_418)));
        local_240 = auVar4._0_8_;
        uStack_238 = auVar4._8_8_;
        uStack_230 = auVar4._16_8_;
        uStack_228 = auVar4._24_8_;
        *puVar10 = local_240;
        puVar10[1] = uStack_238;
        puVar10[2] = uStack_230;
        puVar10[3] = uStack_228;
        puVar10 = (undefined8 *)(in_RDI + (long)(local_420 * in_ESI + local_418 + 0x10) * 2);
        auVar4 = vpmovzxbw_avx2(auVar3);
        local_280 = auVar4._0_8_;
        uStack_278 = auVar4._8_8_;
        uStack_270 = auVar4._16_8_;
        uStack_268 = auVar4._24_8_;
        *puVar10 = local_280;
        puVar10[1] = uStack_278;
        puVar10[2] = uStack_270;
        puVar10[3] = uStack_268;
        puVar10 = (undefined8 *)(in_RDI + (long)((local_420 + 1) * in_ESI + local_418) * 2);
        auVar4 = vpmovzxbw_avx2(auVar5);
        local_2c0 = auVar4._0_8_;
        uStack_2b8 = auVar4._8_8_;
        uStack_2b0 = auVar4._16_8_;
        uStack_2a8 = auVar4._24_8_;
        *puVar10 = local_2c0;
        puVar10[1] = uStack_2b8;
        puVar10[2] = uStack_2b0;
        puVar10[3] = uStack_2a8;
        puVar10 = (undefined8 *)(in_RDI + (long)((local_420 + 1) * in_ESI + local_418 + 0x10) * 2);
        auVar4 = vpmovzxbw_avx2(auVar6);
        local_300 = auVar4._0_8_;
        uStack_2f8 = auVar4._8_8_;
        uStack_2f0 = auVar4._16_8_;
        uStack_2e8 = auVar4._24_8_;
        *puVar10 = local_300;
        puVar10[1] = uStack_2f8;
        puVar10[2] = uStack_2f0;
        puVar10[3] = uStack_2e8;
        local_418 = local_418 + 0x20;
      } while (local_418 <= (int)(in_R8D - 0x20));
      local_420 = local_420 + 2;
    } while (local_420 < in_R9D);
    local_41c = in_R8D & 0x1f;
  }
  if (0xf < (int)local_41c) {
    local_464 = 0;
    do {
      auVar3 = *(undefined1 (*) [16])(in_RDX + ((local_464 + 1) * in_ECX + local_418));
      puVar10 = (undefined8 *)(in_RDI + (long)(local_464 * in_ESI + local_418) * 2);
      auVar4 = vpmovzxbw_avx2(*(undefined1 (*) [16])(in_RDX + (local_464 * in_ECX + local_418)));
      local_340 = auVar4._0_8_;
      uStack_338 = auVar4._8_8_;
      uStack_330 = auVar4._16_8_;
      uStack_328 = auVar4._24_8_;
      *puVar10 = local_340;
      puVar10[1] = uStack_338;
      puVar10[2] = uStack_330;
      puVar10[3] = uStack_328;
      puVar10 = (undefined8 *)(in_RDI + (long)((local_464 + 1) * in_ESI + local_418) * 2);
      auVar4 = vpmovzxbw_avx2(auVar3);
      local_380 = auVar4._0_8_;
      uStack_378 = auVar4._8_8_;
      uStack_370 = auVar4._16_8_;
      uStack_368 = auVar4._24_8_;
      *puVar10 = local_380;
      puVar10[1] = uStack_378;
      puVar10[2] = uStack_370;
      puVar10[3] = uStack_368;
      local_464 = local_464 + 2;
    } while (local_464 < in_R9D);
    local_41c = in_R8D & 0xf;
    local_418 = local_418 + 0x10;
  }
  if (7 < (int)local_41c) {
    local_494 = 0;
    do {
      uVar1 = *(ulong *)(in_RDX + ((local_494 + 1) * in_ECX + local_418));
      puVar10 = (undefined8 *)(in_RDI + (long)(local_494 * in_ESI + local_418) * 2);
      uStack_78 = SUB168(ZEXT816(0),4);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = *(ulong *)(in_RDX + (local_494 * in_ECX + local_418));
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uStack_78;
      auVar3 = vpunpcklbw_avx(auVar5,auVar6 << 0x40);
      local_150 = auVar3._0_8_;
      uStack_148 = auVar3._8_8_;
      *puVar10 = local_150;
      puVar10[1] = uStack_148;
      puVar10 = (undefined8 *)(in_RDI + (long)((local_494 + 1) * in_ESI + local_418) * 2);
      auVar3._8_8_ = 0;
      auVar3._0_8_ = uVar1;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uStack_78;
      auVar3 = vpunpcklbw_avx(auVar3,auVar7 << 0x40);
      local_170 = auVar3._0_8_;
      uStack_168 = auVar3._8_8_;
      *puVar10 = local_170;
      puVar10[1] = uStack_168;
      local_494 = local_494 + 2;
    } while (local_494 < in_R9D);
    local_41c = in_R8D & 7;
    local_418 = local_418 + 8;
  }
  if (3 < (int)local_41c) {
    local_4c4 = 0;
    do {
      uVar2 = *(uint *)(in_RDX + ((local_4c4 + 1) * in_ECX + local_418));
      uStack_98 = SUB168(ZEXT816(0),4);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uStack_98;
      auVar3 = vpunpcklbw_avx(ZEXT416(*(uint *)(in_RDX + (local_4c4 * in_ECX + local_418))),
                              auVar8 << 0x40);
      local_50 = auVar3._0_8_;
      *(undefined8 *)(in_RDI + (long)(local_4c4 * in_ESI + local_418) * 2) = local_50;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uStack_98;
      auVar3 = vpunpcklbw_avx(ZEXT416(uVar2),auVar9 << 0x40);
      local_70 = auVar3._0_8_;
      *(undefined8 *)(in_RDI + (long)((local_4c4 + 1) * in_ESI + local_418) * 2) = local_70;
      local_4c4 = local_4c4 + 2;
    } while (local_4c4 < in_R9D);
    local_41c = in_R8D & 3;
    local_418 = local_418 + 4;
  }
  if (local_41c != 0) {
    for (local_4f4 = 0; local_4f4 < in_R9D; local_4f4 = local_4f4 + 1) {
      for (local_4f8 = local_418; local_4f8 < (int)in_R8D; local_4f8 = local_4f8 + 1) {
        *(ushort *)(in_RDI + (long)(local_4f4 * in_ESI + local_4f8) * 2) =
             (ushort)*(byte *)(in_RDX + (local_4f4 * in_ECX + local_4f8));
      }
    }
  }
  return;
}

Assistant:

void cdef_copy_rect8_8bit_to_16bit_avx2(uint16_t *dst, int dstride,
                                        const uint8_t *src, int sstride,
                                        int width, int height) {
  int j = 0;
  int remaining_width = width;
  assert(height % 2 == 0);
  assert(height > 0);
  assert(width > 0);

  // Process multiple 32 pixels at a time.
  if (remaining_width > 31) {
    int i = 0;
    do {
      j = 0;
      do {
        __m128i row00 =
            _mm_loadu_si128((const __m128i *)&src[(i + 0) * sstride + (j + 0)]);
        __m128i row01 = _mm_loadu_si128(
            (const __m128i *)&src[(i + 0) * sstride + (j + 16)]);
        __m128i row10 =
            _mm_loadu_si128((const __m128i *)&src[(i + 1) * sstride + (j + 0)]);
        __m128i row11 = _mm_loadu_si128(
            (const __m128i *)&src[(i + 1) * sstride + (j + 16)]);
        _mm256_storeu_si256((__m256i *)&dst[(i + 0) * dstride + (j + 0)],
                            _mm256_cvtepu8_epi16(row00));
        _mm256_storeu_si256((__m256i *)&dst[(i + 0) * dstride + (j + 16)],
                            _mm256_cvtepu8_epi16(row01));
        _mm256_storeu_si256((__m256i *)&dst[(i + 1) * dstride + (j + 0)],
                            _mm256_cvtepu8_epi16(row10));
        _mm256_storeu_si256((__m256i *)&dst[(i + 1) * dstride + (j + 16)],
                            _mm256_cvtepu8_epi16(row11));
        j += 32;
      } while (j <= width - 32);
      i += 2;
    } while (i < height);
    remaining_width = width & 31;
  }

  // Process 16 pixels at a time.
  if (remaining_width > 15) {
    int i = 0;
    do {
      __m128i row0 =
          _mm_loadu_si128((const __m128i *)&src[(i + 0) * sstride + j]);
      __m128i row1 =
          _mm_loadu_si128((const __m128i *)&src[(i + 1) * sstride + j]);
      _mm256_storeu_si256((__m256i *)&dst[(i + 0) * dstride + j],
                          _mm256_cvtepu8_epi16(row0));
      _mm256_storeu_si256((__m256i *)&dst[(i + 1) * dstride + j],
                          _mm256_cvtepu8_epi16(row1));
      i += 2;
    } while (i < height);
    remaining_width = width & 15;
    j += 16;
  }

  // Process 8 pixels at a time.
  if (remaining_width > 7) {
    int i = 0;
    do {
      __m128i row0 =
          _mm_loadl_epi64((const __m128i *)&src[(i + 0) * sstride + j]);
      __m128i row1 =
          _mm_loadl_epi64((const __m128i *)&src[(i + 1) * sstride + j]);
      _mm_storeu_si128((__m128i *)&dst[(i + 0) * dstride + j],
                       _mm_unpacklo_epi8(row0, _mm_setzero_si128()));
      _mm_storeu_si128((__m128i *)&dst[(i + 1) * dstride + j],
                       _mm_unpacklo_epi8(row1, _mm_setzero_si128()));
      i += 2;
    } while (i < height);
    remaining_width = width & 7;
    j += 8;
  }

  // Process 4 pixels at a time.
  if (remaining_width > 3) {
    int i = 0;
    do {
      __m128i row0 =
          _mm_cvtsi32_si128(*((const int32_t *)&src[(i + 0) * sstride + j]));
      __m128i row1 =
          _mm_cvtsi32_si128(*((const int32_t *)&src[(i + 1) * sstride + j]));
      _mm_storel_epi64((__m128i *)&dst[(i + 0) * dstride + j],
                       _mm_unpacklo_epi8(row0, _mm_setzero_si128()));
      _mm_storel_epi64((__m128i *)&dst[(i + 1) * dstride + j],
                       _mm_unpacklo_epi8(row1, _mm_setzero_si128()));
      i += 2;
    } while (i < height);
    remaining_width = width & 3;
    j += 4;
  }

  // Process the remaining pixels.
  if (remaining_width) {
    for (int i = 0; i < height; i++) {
      for (int k = j; k < width; k++) {
        dst[i * dstride + k] = src[i * sstride + k];
      }
    }
  }
}